

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O1

bool __thiscall ON_Linetype::IsValid(ON_Linetype *this,ON_TextLog *text_log)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  ON_LinetypeSegment *pOVar4;
  bool bVar5;
  long lVar6;
  char *format;
  
  bVar5 = ON_ModelComponent::IsValid(&this->super_ON_ModelComponent,text_log);
  if (bVar5) {
    uVar2 = (this->m_private->m_segments).m_count;
    if ((int)uVar2 < 1) {
      if (text_log != (ON_TextLog *)0x0) {
        format = "ON_Linetype m_segments.Count() = 0\n";
        goto LAB_004d10f5;
      }
    }
    else {
      pOVar4 = (this->m_private->m_segments).m_a;
      if (uVar2 != 1) {
        lVar6 = 0;
        do {
          dVar1 = *(double *)((long)&pOVar4->m_length + lVar6);
          if (dVar1 < 0.0) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            format = "ON_Linetype segment has negative length.\n";
            goto LAB_004d10f5;
          }
          iVar3 = *(int *)((long)&pOVar4->m_seg_type + lVar6);
          if (1 < iVar3 - 1U) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            format = "ON_Linetype segment has invalid m_seg_type.\n";
            goto LAB_004d10f5;
          }
          if (lVar6 != 0) {
            if (iVar3 == *(int *)((long)pOVar4 + lVar6 + -8)) {
              if (text_log == (ON_TextLog *)0x0) {
                return false;
              }
              format = "ON_Linetype consecutive segments have same type.\n";
              goto LAB_004d10f5;
            }
            if ((((dVar1 == 0.0) && (!NAN(dVar1))) &&
                (dVar1 = *(double *)((long)&pOVar4[-1].m_length + lVar6), dVar1 == 0.0)) &&
               (!NAN(dVar1))) {
              if (text_log == (ON_TextLog *)0x0) {
                return false;
              }
              format = "ON_Linetype consecutive segments have length zero.\n";
              goto LAB_004d10f5;
            }
          }
          lVar6 = lVar6 + 0x10;
          if ((ulong)uVar2 << 4 == lVar6) {
            return true;
          }
        } while( true );
      }
      if (pOVar4->m_length <= 0.0) {
        if (text_log != (ON_TextLog *)0x0) {
          format = "ON_Linetype bogus single segment linetype - length <= 0.0 (it must be > 0)\n";
          goto LAB_004d10f5;
        }
      }
      else {
        if (pOVar4->m_seg_type == stLine) {
          return true;
        }
        if (text_log != (ON_TextLog *)0x0) {
          format = "ON_Linetype bogus single segment linetype - type != stLine\n";
LAB_004d10f5:
          ON_TextLog::Print(text_log,format);
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Linetype::IsValid( ON_TextLog* text_log ) const
{
  if (false == ON_ModelComponent::IsValid(text_log))
    return false;

  // An ON_Linetype with an empty name is valid.

  const ON_SimpleArray<ON_LinetypeSegment>& segments = m_private->m_segments;
  int count = segments.Count();
  if ( count < 1 )
  {
    if ( text_log )
      text_log->Print("ON_Linetype m_segments.Count() = 0\n");
    return false;
  }

  if ( 1 == count )
  {
    if ( segments[0].m_length <= 0.0  )
    {
      if ( text_log )
        text_log->Print("ON_Linetype bogus single segment linetype - length <= 0.0 (it must be > 0)\n");
      return false;
    }

    if ( ON_LinetypeSegment::eSegType::stLine != segments[0].m_seg_type )
    {
      if ( text_log )
        text_log->Print("ON_Linetype bogus single segment linetype - type != stLine\n");
      return false;
    }
  }
  else
  {
    for (int i = 0; i < count; i++ )
    {
      if ( segments[i].m_length < 0.0 )
      {
        if ( text_log )
          text_log->Print("ON_Linetype segment has negative length.\n");
        return false;
      }

      if ( ON_LinetypeSegment::eSegType::stLine != segments[i].m_seg_type && ON_LinetypeSegment::eSegType::stSpace != segments[i].m_seg_type )
      {
        if ( text_log )
          text_log->Print("ON_Linetype segment has invalid m_seg_type.\n");
        return false;
      }

      if ( i )
      {
        if ( segments[i].m_seg_type == segments[i-1].m_seg_type )
        {
          if ( text_log )
            text_log->Print("ON_Linetype consecutive segments have same type.\n");
          return false;
        }

        if ( 0.0 == segments[i].m_length && 0.0 == segments[i-1].m_length )
        {
          if ( text_log )
            text_log->Print("ON_Linetype consecutive segments have length zero.\n");
          return false;
        }
      }
    }
  }

  return true;
}